

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

int internal_path_submit(CManager_conflict cm,int param_2,event_item *event)

{
  event_path_data evp;
  int iVar1;
  stone_type p_Var2;
  int *piVar3;
  
  iVar1 = CManager_locked(cm);
  if (iVar1 != 0) {
    evp = cm->evp;
    p_Var2 = stone_struct(evp,param_2);
    piVar3 = (int *)evp->as;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)INT_CMmalloc(8);
      evp->as = piVar3;
      piVar3[0] = 0;
      piVar3[1] = 0;
    }
    raw_enqueue_event(cm,p_Var2->queue,event);
    p_Var2->new_enqueue_flag = 1;
    p_Var2->queue_size = p_Var2->queue_size + 1;
    backpressure_check(cm,param_2);
    *piVar3 = param_2;
    piVar3[1] = piVar3[1] + 1;
    return 1;
  }
  __assert_fail("CManager_locked(cm)",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                ,0x604,"int internal_path_submit(CManager, int, event_item *)");
}

Assistant:

int
internal_path_submit(CManager cm, int local_path_id, event_item *event)
{
    event_item *event_to_submit = event;

    assert(CManager_locked(cm));
    enqueue_event(cm, local_path_id, event_to_submit);
    return 1;
}